

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  Rep *pRVar1;
  void *pvVar2;
  CppType CVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  LogMessage local_68;
  LogFinisher local_29;
  
  pEVar4 = FindOrNull(this,number);
  if (pEVar4 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
               ,0x34e);
    pLVar5 = LogMessage::operator<<(&local_68,"CHECK failed: extension != NULL: ");
    pLVar5 = LogMessage::operator<<(pLVar5,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_29,pLVar5);
    LogMessage::~LogMessage(&local_68);
  }
  if (pEVar4->is_repeated == false) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/extension_set.cc"
               ,0x34f);
    pLVar5 = LogMessage::operator<<(&local_68,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_29,pLVar5);
    LogMessage::~LogMessage(&local_68);
  }
  CVar3 = anon_unknown_22::cpp_type(pEVar4->type);
  switch(CVar3) {
  case CPPTYPE_INT32:
  case CPPTYPE_ENUM:
    RepeatedField<int>::SwapElements((pEVar4->field_0).repeated_int32_value,index1,index2);
    break;
  case CPPTYPE_INT64:
    RepeatedField<long>::SwapElements((pEVar4->field_0).repeated_int64_value,index1,index2);
    break;
  case CPPTYPE_UINT32:
    RepeatedField<unsigned_int>::SwapElements((pEVar4->field_0).repeated_uint32_value,index1,index2)
    ;
    break;
  case CPPTYPE_UINT64:
    RepeatedField<unsigned_long>::SwapElements
              ((pEVar4->field_0).repeated_uint64_value,index1,index2);
    break;
  case CPPTYPE_DOUBLE:
    RepeatedField<double>::SwapElements((pEVar4->field_0).repeated_double_value,index1,index2);
    break;
  case CPPTYPE_FLOAT:
    RepeatedField<float>::SwapElements((pEVar4->field_0).repeated_float_value,index1,index2);
    break;
  case CPPTYPE_BOOL:
    RepeatedField<bool>::SwapElements((pEVar4->field_0).repeated_bool_value,index1,index2);
    break;
  case CPPTYPE_STRING:
  case CPPTYPE_MESSAGE:
    pRVar1 = (((pEVar4->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).rep_;
    pvVar2 = pRVar1->elements[index1];
    pRVar1->elements[index1] = pRVar1->elements[index2];
    pRVar1->elements[index2] = pvVar2;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);

  switch (cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}